

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::CopyPropagateArrays::FindStoreInstruction
          (CopyPropagateArrays *this,Instruction *var_inst)

{
  DefUseManager *this_00;
  Instruction *store_inst;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  store_inst = (Instruction *)0x0;
  this_00 = Pass::get_def_use_mgr((Pass *)this);
  local_20 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/copy_prop_arrays.cpp:142:17)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/copy_prop_arrays.cpp:142:17)>
             ::_M_manager;
  local_38._M_unused._M_object = &store_inst;
  local_38._8_8_ = var_inst;
  analysis::DefUseManager::WhileEachUser
            (this_00,var_inst,(function<bool_(spvtools::opt::Instruction_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return store_inst;
}

Assistant:

Instruction* CopyPropagateArrays::FindStoreInstruction(
    const Instruction* var_inst) const {
  Instruction* store_inst = nullptr;
  get_def_use_mgr()->WhileEachUser(
      var_inst, [&store_inst, var_inst](Instruction* use) {
        if (use->opcode() == spv::Op::OpStore &&
            use->GetSingleWordInOperand(kStorePointerInOperand) ==
                var_inst->result_id()) {
          if (store_inst == nullptr) {
            store_inst = use;
          } else {
            store_inst = nullptr;
            return false;
          }
        }
        return true;
      });
  return store_inst;
}